

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::dragMoveEvent(QAbstractItemView *this,QDragMoveEvent *event)

{
  QRect QVar1;
  QRect QVar2;
  QRect QVar3;
  QRect QVar4;
  QRect QVar5;
  QRect QVar6;
  QRect QVar7;
  bool bVar8;
  DragDropMode DVar9;
  DropIndicatorPosition DVar10;
  int iVar11;
  QAbstractItemViewPrivate *pQVar12;
  long *plVar13;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QRect rect;
  QModelIndex index;
  int in_stack_fffffffffffffdd8;
  DropAction in_stack_fffffffffffffddc;
  QAbstractItemViewPrivate *in_stack_fffffffffffffde0;
  QAbstractItemViewPrivate *in_stack_fffffffffffffde8;
  QAbstractItemViewPrivate *in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  QAbstractItemViewPrivate *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  QAbstractItemViewPrivate *in_stack_fffffffffffffe28;
  QAbstractItemViewPrivate *pQVar14;
  bool local_1c9;
  bool local_1b9;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined1 local_b8 [24];
  QRect local_a0;
  QPointF local_90;
  QPoint local_80;
  undefined1 local_78 [16];
  QPointF local_68;
  QPoint local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_40;
  QFlagsStorageHelper<Qt::DropAction,_4> local_38;
  QFlagsStorageHelper<Qt::DropAction,_4> local_34;
  QPoint local_30;
  QPointF local_28;
  QPoint local_18;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = d_func((QAbstractItemView *)0x8062bb);
  local_28 = QDropEvent::position((QDropEvent *)in_stack_fffffffffffffde8);
  local_18 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffdf0);
  local_30 = QAbstractItemViewPrivate::offset(in_stack_fffffffffffffdf0);
  local_10 = ::operator+((QPoint *)in_stack_fffffffffffffdf0,(QPoint *)in_stack_fffffffffffffde8);
  pQVar12->draggedPosition = local_10;
  DVar9 = dragDropMode((QAbstractItemView *)in_stack_fffffffffffffde8);
  local_1b9 = false;
  if (DVar9 == InternalMove) {
    plVar13 = (long *)QDropEvent::source();
    local_1c9 = true;
    if (plVar13 == in_RDI) {
      local_38.super_QFlagsStorage<Qt::DropAction>.i =
           (QFlagsStorage<Qt::DropAction>)
           QDropEvent::possibleActions((QDropEvent *)in_stack_fffffffffffffde0);
      local_34.super_QFlagsStorage<Qt::DropAction>.i =
           (QFlagsStorage<Qt::DropAction>)
           QFlags<Qt::DropAction>::operator&
                     ((QFlags<Qt::DropAction> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc)
      ;
      local_1c9 = QFlags<Qt::DropAction>::operator!((QFlags<Qt::DropAction> *)&local_34);
    }
    local_1b9 = local_1c9;
  }
  QVar7.x2.m_i = local_78._8_4_;
  QVar7.y2.m_i = local_78._12_4_;
  QVar7.x1.m_i = local_78._0_4_;
  QVar7.y1.m_i = local_78._4_4_;
  QVar6.x2.m_i = local_a0.x2.m_i;
  QVar6.y2.m_i = local_a0.y2.m_i;
  QVar6.x1.m_i = local_a0.x1.m_i;
  QVar6.y1.m_i = local_a0.y1.m_i;
  if (local_1b9 != false) goto LAB_00806a2c;
  QDragMoveEvent::ignore((QDragMoveEvent *)0x8063c4);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = QDropEvent::position((QDropEvent *)in_stack_fffffffffffffde8);
  local_58 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffdf0);
  (**(code **)(*in_RDI + 0x1f0))(&local_50,in_RDI,&local_58);
  QPersistentModelIndex::operator=(&pQVar12->hover,(QModelIndex *)&local_50);
  bVar8 = QAbstractItemViewPrivate::droppingOnItself
                    (in_stack_fffffffffffffe00,
                     (QDropEvent *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     (QModelIndex *)in_stack_fffffffffffffdf0);
  QVar5.x2.m_i = local_78._8_4_;
  QVar5.y2.m_i = local_78._12_4_;
  QVar5.x1.m_i = local_78._0_4_;
  QVar5.y1.m_i = local_78._4_4_;
  QVar4.x2.m_i = local_a0.x2.m_i;
  QVar4.y2.m_i = local_a0.y2.m_i;
  QVar4.x1.m_i = local_a0.x1.m_i;
  QVar4.y1.m_i = local_a0.y1.m_i;
  if (!bVar8) {
    bVar8 = QAbstractItemViewPrivate::canDrop
                      (in_stack_fffffffffffffe28,
                       (QDropEvent *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    QVar5.x2.m_i = local_78._8_4_;
    QVar5.y2.m_i = local_78._12_4_;
    QVar5.x1.m_i = local_78._0_4_;
    QVar5.y1.m_i = local_78._4_4_;
    QVar4.x2.m_i = local_a0.x2.m_i;
    QVar4.y2.m_i = local_a0.y2.m_i;
    QVar4.x1.m_i = local_a0.x1.m_i;
    QVar4.y1.m_i = local_a0.y1.m_i;
    if (bVar8) {
      bVar8 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffde0);
      if ((bVar8) && ((pQVar12->showDropIndicator & 1U) != 0)) {
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = (**(code **)(*in_RDI + 0x1e0))(in_RDI,&local_50);
        pQVar14 = pQVar12;
        local_90 = QDropEvent::position((QDropEvent *)in_stack_fffffffffffffde8);
        local_80 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffdf0);
        DVar10 = (**(code **)(*(long *)&(pQVar14->super_QAbstractScrollAreaPrivate).
                                        super_QFramePrivate.super_QWidgetPrivate + 0x120))
                           (pQVar14,&local_80,local_78,&local_50);
        QVar2.x2.m_i = local_a0.x2.m_i;
        QVar2.y2.m_i = local_a0.y2.m_i;
        QVar2.x1.m_i = local_a0.x1.m_i;
        QVar2.y1.m_i = local_a0.y1.m_i;
        QVar1.x2.m_i = local_a0.x2.m_i;
        QVar1.y2.m_i = local_a0.y2.m_i;
        QVar1.x1.m_i = local_a0.x1.m_i;
        QVar1.y1.m_i = local_a0.y1.m_i;
        pQVar12->dropIndicatorPosition = DVar10;
        if ((pQVar12->selectionBehavior == SelectRows) &&
           (QVar1 = QVar2, pQVar12->dropIndicatorPosition != OnViewport)) {
          if (pQVar12->dropIndicatorPosition == OnItem) {
            plVar13 = (long *)QDropEvent::source();
            QVar1.x2.m_i = local_a0.x2.m_i;
            QVar1.y2.m_i = local_a0.y2.m_i;
            QVar1.x1.m_i = local_a0.x1.m_i;
            QVar1.y1.m_i = local_a0.y1.m_i;
            if (plVar13 != in_RDI) goto LAB_0080665c;
          }
          iVar11 = QModelIndex::column((QModelIndex *)&local_50);
          if (0 < iVar11) {
            QModelIndex::siblingAtColumn
                      ((QModelIndex *)in_stack_fffffffffffffdf0,
                       (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
            local_a0 = (QRect)(**(code **)(*in_RDI + 0x1e0))(in_RDI,local_b8);
            local_78 = (undefined1  [16])local_a0;
          }
          QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffde0);
          QWidget::width((QWidget *)0x806635);
          QRect::x((QRect *)0x806649);
          QRect::setWidth((QRect *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          QVar1 = local_a0;
        }
LAB_0080665c:
        QVar3 = (QRect)local_78;
        local_a0 = QVar1;
        switch(pQVar12->dropIndicatorPosition) {
        case OnItem:
          bVar8 = QAbstractItemViewPrivate::isIndexDropEnabled
                            (in_stack_fffffffffffffde0,
                             (QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          if (bVar8) {
            (pQVar12->dropIndicatorRect).x1 = (Representation)local_78._0_4_;
            (pQVar12->dropIndicatorRect).y1 = (Representation)local_78._4_4_;
            (pQVar12->dropIndicatorRect).x2 = (Representation)local_78._8_4_;
            (pQVar12->dropIndicatorRect).y2 = (Representation)local_78._12_4_;
            QDropEvent::acceptProposedAction((QDropEvent *)0x806899);
            QVar1 = local_a0;
            QVar3 = (QRect)local_78;
          }
          else {
            QRect::QRect((QRect *)in_stack_fffffffffffffde0);
            (pQVar12->dropIndicatorRect).x1 = (Representation)(undefined4)local_138;
            (pQVar12->dropIndicatorRect).y1 = (Representation)local_138._4_4_;
            (pQVar12->dropIndicatorRect).x2 = (Representation)(undefined4)local_130;
            (pQVar12->dropIndicatorRect).y2 = (Representation)local_130._4_4_;
            QVar1 = local_a0;
            QVar3 = (QRect)local_78;
          }
          break;
        case AboveItem:
          QModelIndex::parent((QModelIndex *)in_stack_fffffffffffffdf0);
          bVar8 = QAbstractItemViewPrivate::isIndexDropEnabled
                            (in_stack_fffffffffffffde0,
                             (QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          if (bVar8) {
            QRect::left((QRect *)0x8066d0);
            QRect::top((QRect *)0x8066e1);
            QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
            QRect::QRect((QRect *)in_stack_fffffffffffffde8,
                         (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                         (int)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,
                         in_stack_fffffffffffffdd8);
            (pQVar12->dropIndicatorRect).x1 = (Representation)(undefined4)local_e0;
            (pQVar12->dropIndicatorRect).y1 = (Representation)local_e0._4_4_;
            (pQVar12->dropIndicatorRect).x2 = (Representation)(undefined4)local_d8;
            (pQVar12->dropIndicatorRect).y2 = (Representation)local_d8._4_4_;
            QDropEvent::acceptProposedAction((QDropEvent *)0x806739);
            QVar1 = local_a0;
            QVar3 = (QRect)local_78;
          }
          else {
            QRect::QRect((QRect *)in_stack_fffffffffffffde0);
            (pQVar12->dropIndicatorRect).x1 = (Representation)(undefined4)local_f0;
            (pQVar12->dropIndicatorRect).y1 = (Representation)local_f0._4_4_;
            (pQVar12->dropIndicatorRect).x2 = (Representation)(undefined4)local_e8;
            (pQVar12->dropIndicatorRect).y2 = (Representation)local_e8._4_4_;
            QVar1 = local_a0;
            QVar3 = (QRect)local_78;
          }
          break;
        case BelowItem:
          in_stack_fffffffffffffe00 = pQVar12;
          QModelIndex::parent((QModelIndex *)in_stack_fffffffffffffdf0);
          bVar8 = QAbstractItemViewPrivate::isIndexDropEnabled
                            (in_stack_fffffffffffffde0,
                             (QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          if (bVar8) {
            in_stack_fffffffffffffdf8 = QRect::left((QRect *)0x8067b4);
            in_stack_fffffffffffffdfc = QRect::bottom((QRect *)0x8067c5);
            QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
            QRect::QRect((QRect *)in_stack_fffffffffffffde8,
                         (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                         (int)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,
                         in_stack_fffffffffffffdd8);
            (pQVar12->dropIndicatorRect).x1 = (Representation)(undefined4)local_118;
            (pQVar12->dropIndicatorRect).y1 = (Representation)local_118._4_4_;
            (pQVar12->dropIndicatorRect).x2 = (Representation)(undefined4)local_110;
            (pQVar12->dropIndicatorRect).y2 = (Representation)local_110._4_4_;
            QDropEvent::acceptProposedAction((QDropEvent *)0x80681d);
            QVar1 = local_a0;
            QVar3 = (QRect)local_78;
          }
          else {
            QRect::QRect((QRect *)in_stack_fffffffffffffde0);
            (pQVar12->dropIndicatorRect).x1 = (Representation)(undefined4)local_128;
            (pQVar12->dropIndicatorRect).y1 = (Representation)local_128._4_4_;
            (pQVar12->dropIndicatorRect).x2 = (Representation)(undefined4)local_120;
            (pQVar12->dropIndicatorRect).y2 = (Representation)local_120._4_4_;
            QVar1 = local_a0;
            QVar3 = (QRect)local_78;
          }
          break;
        case OnViewport:
          QRect::QRect((QRect *)in_stack_fffffffffffffde0);
          (pQVar12->dropIndicatorRect).x1 = (Representation)(undefined4)local_148;
          (pQVar12->dropIndicatorRect).y1 = (Representation)local_148._4_4_;
          (pQVar12->dropIndicatorRect).x2 = (Representation)(undefined4)local_140;
          (pQVar12->dropIndicatorRect).y2 = (Representation)local_140._4_4_;
          rootIndex((QAbstractItemView *)in_stack_fffffffffffffde0);
          bVar8 = QAbstractItemViewPrivate::isIndexDropEnabled
                            (in_stack_fffffffffffffde0,
                             (QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          in_stack_fffffffffffffdf0 = pQVar12;
          QVar1 = local_a0;
          QVar3 = (QRect)local_78;
          if (bVar8) {
            QDropEvent::acceptProposedAction((QDropEvent *)0x80693b);
            in_stack_fffffffffffffdf0 = pQVar12;
            QVar1 = local_a0;
            QVar3 = (QRect)local_78;
          }
        }
      }
      else {
        QRect::QRect((QRect *)in_stack_fffffffffffffde0);
        (pQVar12->dropIndicatorRect).x1 = (Representation)(undefined4)local_170;
        (pQVar12->dropIndicatorRect).y1 = (Representation)local_170._4_4_;
        (pQVar12->dropIndicatorRect).x2 = (Representation)(undefined4)local_168;
        (pQVar12->dropIndicatorRect).y2 = (Representation)local_168._4_4_;
        pQVar12->dropIndicatorPosition = OnViewport;
        rootIndex((QAbstractItemView *)in_stack_fffffffffffffde0);
        bVar8 = QAbstractItemViewPrivate::isIndexDropEnabled
                          (in_stack_fffffffffffffde0,
                           (QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        QVar3.x2.m_i = local_78._8_4_;
        QVar3.y2.m_i = local_78._12_4_;
        QVar3.x1.m_i = local_78._0_4_;
        QVar3.y1.m_i = local_78._4_4_;
        QVar1.x2.m_i = local_a0.x2.m_i;
        QVar1.y2.m_i = local_a0.y2.m_i;
        QVar1.x1.m_i = local_a0.x1.m_i;
        QVar1.y1.m_i = local_a0.y1.m_i;
        in_stack_fffffffffffffde8 = pQVar12;
        if (bVar8) {
          QDropEvent::acceptProposedAction((QDropEvent *)0x8069bc);
          QVar3.x2.m_i = local_78._8_4_;
          QVar3.y2.m_i = local_78._12_4_;
          QVar3.x1.m_i = local_78._0_4_;
          QVar3.y1.m_i = local_78._4_4_;
          QVar1.x2.m_i = local_a0.x2.m_i;
          QVar1.y2.m_i = local_a0.y2.m_i;
          QVar1.x1.m_i = local_a0.x1.m_i;
          QVar1.y1.m_i = local_a0.y1.m_i;
          in_stack_fffffffffffffde8 = pQVar12;
        }
      }
      local_a0 = QVar1;
      local_78 = (undefined1  [16])QVar3;
      QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      QVar4 = local_a0;
      QVar5 = (QRect)local_78;
    }
  }
  local_a0 = QVar4;
  local_78 = (undefined1  [16])QVar5;
  QDropEvent::position((QDropEvent *)in_stack_fffffffffffffde8);
  QPointF::toPoint((QPointF *)in_stack_fffffffffffffdf0);
  bVar8 = QAbstractItemViewPrivate::shouldAutoScroll
                    (in_stack_fffffffffffffe00,
                     (QPoint *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  QVar6 = local_a0;
  QVar7 = (QRect)local_78;
  if (bVar8) {
    startAutoScroll((QAbstractItemView *)0x806a2c);
    QVar6 = local_a0;
    QVar7 = (QRect)local_78;
  }
LAB_00806a2c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    local_a0 = QVar6;
    local_78 = (undefined1  [16])QVar7;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::dragMoveEvent(QDragMoveEvent *event)
{
    Q_D(QAbstractItemView);
    d->draggedPosition = event->position().toPoint() + d->offset();
    if (dragDropMode() == InternalMove
        && (event->source() != this || !(event->possibleActions() & Qt::MoveAction)))
        return;

    // ignore by default
    event->ignore();

    QModelIndex index = indexAt(event->position().toPoint());
    d->hover = index;
    if (!d->droppingOnItself(event, index)
        && d->canDrop(event)) {

        if (index.isValid() && d->showDropIndicator) {
            QRect rect = visualRect(index);
            d->dropIndicatorPosition = d->position(event->position().toPoint(), rect, index);
            if (d->selectionBehavior == QAbstractItemView::SelectRows
                && d->dropIndicatorPosition != OnViewport
                && (d->dropIndicatorPosition != OnItem || event->source() == this)) {
                if (index.column() > 0)
                    rect = visualRect(index.siblingAtColumn(0));
                rect.setWidth(viewport()->width() - 1 - rect.x());
            }
            switch (d->dropIndicatorPosition) {
            case AboveItem:
                if (d->isIndexDropEnabled(index.parent())) {
                    d->dropIndicatorRect = QRect(rect.left(), rect.top(), rect.width(), 0);
                    event->acceptProposedAction();
                } else {
                    d->dropIndicatorRect = QRect();
                }
                break;
            case BelowItem:
                if (d->isIndexDropEnabled(index.parent())) {
                    d->dropIndicatorRect = QRect(rect.left(), rect.bottom(), rect.width(), 0);
                    event->acceptProposedAction();
                } else {
                    d->dropIndicatorRect = QRect();
                }
                break;
            case OnItem:
                if (d->isIndexDropEnabled(index)) {
                    d->dropIndicatorRect = rect;
                    event->acceptProposedAction();
                } else {
                    d->dropIndicatorRect = QRect();
                }
                break;
            case OnViewport:
                d->dropIndicatorRect = QRect();
                if (d->isIndexDropEnabled(rootIndex())) {
                    event->acceptProposedAction(); // allow dropping in empty areas
                }
                break;
            }
        } else {
            d->dropIndicatorRect = QRect();
            d->dropIndicatorPosition = OnViewport;
            if (d->isIndexDropEnabled(rootIndex())) {
                event->acceptProposedAction(); // allow dropping in empty areas
            }
        }
        d->viewport->update();
    } // can drop

    if (d->shouldAutoScroll(event->position().toPoint()))
        startAutoScroll();
}